

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_se.c
# Opt level: O2

int h264_coeff_abs_level_minus1
              (bitstream *str,h264_cabac_context *cabac,int cat,int num1,int numgt1,int32_t *val)

{
  int iVar1;
  int iVar2;
  int ctxIdx [2];
  
  iVar1 = 4;
  if (num1 < 4) {
    iVar1 = num1 + 1;
  }
  if (numgt1 != 0) {
    iVar1 = 0;
  }
  iVar2 = (cat != 3) + 3;
  if (numgt1 <= iVar2) {
    iVar2 = numgt1;
  }
  ctxIdx[1] = iVar2 + h264_coeff_abs_level_minus1::basectx[cat] + 5;
  ctxIdx[0] = iVar1 + h264_coeff_abs_level_minus1::basectx[cat];
  iVar1 = h264_cabac_ueg(str,cabac,ctxIdx,2,0,0,0xe,val);
  return iVar1;
}

Assistant:

int h264_coeff_abs_level_minus1(struct bitstream *str, struct h264_cabac_context *cabac, int cat, int num1, int numgt1, int32_t *val) {
	static const int basectx[14] = {
		H264_CABAC_CTXIDX_COEFF_ABS_LEVEL_MINUS1_PRE_CAT0,
		H264_CABAC_CTXIDX_COEFF_ABS_LEVEL_MINUS1_PRE_CAT1,
		H264_CABAC_CTXIDX_COEFF_ABS_LEVEL_MINUS1_PRE_CAT2,
		H264_CABAC_CTXIDX_COEFF_ABS_LEVEL_MINUS1_PRE_CAT3,
		H264_CABAC_CTXIDX_COEFF_ABS_LEVEL_MINUS1_PRE_CAT4,
		H264_CABAC_CTXIDX_COEFF_ABS_LEVEL_MINUS1_PRE_CAT5,
		H264_CABAC_CTXIDX_COEFF_ABS_LEVEL_MINUS1_PRE_CAT6,
		H264_CABAC_CTXIDX_COEFF_ABS_LEVEL_MINUS1_PRE_CAT7,
		H264_CABAC_CTXIDX_COEFF_ABS_LEVEL_MINUS1_PRE_CAT8,
		H264_CABAC_CTXIDX_COEFF_ABS_LEVEL_MINUS1_PRE_CAT9,
		H264_CABAC_CTXIDX_COEFF_ABS_LEVEL_MINUS1_PRE_CAT10,
		H264_CABAC_CTXIDX_COEFF_ABS_LEVEL_MINUS1_PRE_CAT11,
		H264_CABAC_CTXIDX_COEFF_ABS_LEVEL_MINUS1_PRE_CAT12,
		H264_CABAC_CTXIDX_COEFF_ABS_LEVEL_MINUS1_PRE_CAT13,
	};
	int ctxIdx[2];
	ctxIdx[0] = basectx[cat] + (numgt1 ? 0 : (num1 >= 4 ? 4 : num1 + 1));
	int clamp = (cat == H264_CTXBLOCKCAT_CHROMA_DC ? 3 : 4);
	ctxIdx[1] = basectx[cat] + 5 + (numgt1 > clamp ? clamp : numgt1);
	return h264_cabac_ueg(str, cabac, ctxIdx, 2, 0, 0, 14, val);
}